

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

Aig_Obj_t * Saig_BmcIntervalConstruct_rec(Saig_Bmc_t *p,Aig_Obj_t *pObj,int i,Vec_Int_t *vVisited)

{
  Aig_Man_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  
  pAVar2 = Saig_BmcObjFrame(p,pObj,i);
  if (pAVar2 != (Aig_Obj_t *)0x0) {
    return pAVar2;
  }
  uVar4 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
  if (uVar4 == 2) {
    pAVar1 = p->pAig;
    if ((pObj->field_0).CioId < pAVar1->nTruePis) {
      pAVar2 = Aig_ObjCreateCi(p->pFrm);
      goto LAB_0055ba1c;
    }
    if (pAVar1->nTruePis <= (pObj->field_0).CioId) {
      if ((pObj->field_0).CioId < pAVar1->nTruePis) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar4 = ((pObj->field_0).CioId - pAVar1->nTruePis) + pAVar1->nTruePos;
      if (((int)uVar4 < 0) || (pAVar1->vCos->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar2 = Saig_BmcIntervalConstruct_rec
                         (p,(Aig_Obj_t *)pAVar1->vCos->pArray[uVar4],i + -1,vVisited);
      goto LAB_0055ba1c;
    }
  }
  Saig_BmcIntervalConstruct_rec
            (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),i,vVisited);
  if (uVar4 == 3) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                    ,0x61,"Aig_Obj_t *Saig_BmcObjChild0(Saig_Bmc_t *, Aig_Obj_t *, int)");
    }
    pAVar2 = Saig_BmcObjFrame(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),i);
    pAVar2 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ (ulong)pAVar2);
  }
  else {
    pAVar3 = Saig_BmcObjChild0(p,pObj,i);
    pAVar2 = (Aig_Obj_t *)((ulong)p->pFrm->pConst1 ^ 1);
    if (pAVar3 != pAVar2) {
      Saig_BmcIntervalConstruct_rec
                (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),i,vVisited);
      pAVar1 = p->pFrm;
      pAVar2 = Saig_BmcObjChild0(p,pObj,i);
      pAVar3 = Saig_BmcObjChild1(p,pObj,i);
      pAVar2 = Aig_And(pAVar1,pAVar2,pAVar3);
    }
  }
LAB_0055ba1c:
  if (pAVar2 != (Aig_Obj_t *)0x0) {
    Saig_BmcObjSetFrame(p,pObj,i,pAVar2);
    Vec_IntPush(vVisited,pObj->Id);
    Vec_IntPush(vVisited,i);
    return pAVar2;
  }
  __assert_fail("pRes != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                ,0x1c4,
                "Aig_Obj_t *Saig_BmcIntervalConstruct_rec(Saig_Bmc_t *, Aig_Obj_t *, int, Vec_Int_t *)"
               );
}

Assistant:

Aig_Obj_t * Saig_BmcIntervalConstruct_rec( Saig_Bmc_t * p, Aig_Obj_t * pObj, int i, Vec_Int_t * vVisited )
{
    Aig_Obj_t * pRes;
    pRes = Saig_BmcObjFrame( p, pObj, i );
    if ( pRes != NULL )
        return pRes;
    if ( Saig_ObjIsPi( p->pAig, pObj ) )
        pRes = Aig_ObjCreateCi(p->pFrm);
    else if ( Saig_ObjIsLo( p->pAig, pObj ) )
        pRes = Saig_BmcIntervalConstruct_rec( p, Saig_ObjLoToLi(p->pAig, pObj), i-1, vVisited );
    else if ( Aig_ObjIsCo( pObj ) )
    {
        Saig_BmcIntervalConstruct_rec( p, Aig_ObjFanin0(pObj), i, vVisited );
        pRes = Saig_BmcObjChild0( p, pObj, i );
    }
    else 
    {
        Saig_BmcIntervalConstruct_rec( p, Aig_ObjFanin0(pObj), i, vVisited );
        if ( Saig_BmcObjChild0(p, pObj, i) == Aig_ManConst0(p->pFrm) )
            pRes = Aig_ManConst0(p->pFrm);
        else
        {
            Saig_BmcIntervalConstruct_rec( p, Aig_ObjFanin1(pObj), i, vVisited );
            pRes = Aig_And( p->pFrm, Saig_BmcObjChild0(p, pObj, i), Saig_BmcObjChild1(p, pObj, i) );
        }
    }
    assert( pRes != NULL );
    Saig_BmcObjSetFrame( p, pObj, i, pRes );
    Vec_IntPush( vVisited, Aig_ObjId(pObj) );
    Vec_IntPush( vVisited, i );
    return pRes;
}